

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall
llm_tokenizer_spm_session::resegment
          (llm_tokenizer_spm_session *this,llm_symbol *symbol,
          vector<int,_std::allocator<int>_> *output)

{
  iterator iVar1;
  int j;
  long lVar2;
  llama_token id;
  llama_token token;
  string text;
  llama_token local_50;
  llama_token local_4c;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,symbol->text,symbol->text + symbol->n);
  local_4c = llama_vocab::text_to_token(this->vocab,&local_48);
  if (local_4c == -1) {
    iVar1 = llama_vocab::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
            ::find(&(this->rev_merge)._M_t,&local_48);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->rev_merge)._M_t._M_impl.super__Rb_tree_header) {
      llama_vocab::std::vector<int,_std::allocator<int>_>::reserve
                (output,((long)(output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start >> 2) + symbol->n);
      for (lVar2 = 0; lVar2 < (int)symbol->n; lVar2 = lVar2 + 1) {
        local_50 = llama_vocab::byte_to_token(this->vocab,symbol->text[lVar2]);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)output,&local_50);
      }
    }
    else {
      resegment(this,(this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                     _M_impl.super__Vector_impl_data._M_start + (int)iVar1._M_node[2]._M_color,
                output);
      resegment(this,(this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>.
                     _M_impl.super__Vector_impl_data._M_start + *(int *)&iVar1._M_node[2].field_0x4,
                output);
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)output,&local_4c);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void resegment(llm_symbol & symbol, std::vector<llama_token> & output) {
        auto text = std::string(symbol.text, symbol.n);
        auto token = vocab.text_to_token(text);

        // Do we need to support is_unused?
        if (token != LLAMA_TOKEN_NULL) {
            output.push_back(token);
            return;
        }

        const auto p = rev_merge.find(text);

        if (p == rev_merge.end()) {
            // output any symbols that did not form tokens as bytes.
            output.reserve(output.size() + symbol.n);
            for (int j = 0; j < (int)symbol.n; ++j) {
                llama_token id = vocab.byte_to_token(symbol.text[j]);
                output.push_back(id);
            }
            return;
        }

        resegment(symbols[p->second.first], output);
        resegment(symbols[p->second.second], output);
    }